

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_init(CFL_CTX *cfl,SequenceHeader *seq_params)

{
  int iVar1;
  
  memset(cfl,0,0x1000);
  iVar1 = seq_params->subsampling_y;
  cfl->subsampling_x = seq_params->subsampling_x;
  cfl->subsampling_y = iVar1;
  cfl->are_parameters_computed = 0;
  cfl->store_y = 0;
  cfl->use_dc_pred_cache = false;
  cfl->dc_pred_is_cached[0] = false;
  cfl->dc_pred_is_cached[1] = false;
  return;
}

Assistant:

void cfl_init(CFL_CTX *cfl, const SequenceHeader *seq_params) {
  assert(block_size_wide[CFL_MAX_BLOCK_SIZE] == CFL_BUF_LINE);
  assert(block_size_high[CFL_MAX_BLOCK_SIZE] == CFL_BUF_LINE);

  memset(&cfl->recon_buf_q3, 0, sizeof(cfl->recon_buf_q3));
  memset(&cfl->ac_buf_q3, 0, sizeof(cfl->ac_buf_q3));
  cfl->subsampling_x = seq_params->subsampling_x;
  cfl->subsampling_y = seq_params->subsampling_y;
  cfl->are_parameters_computed = 0;
  cfl->store_y = 0;
  // The DC_PRED cache is disabled by default and is only enabled in
  // cfl_rd_pick_alpha
  clear_cfl_dc_pred_cache_flags(cfl);
}